

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *pFVar8;
  value_type vVar9;
  double dVar10;
  double dVar11;
  value_type vVar12;
  double dVar13;
  
  vVar9 = FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>::dx
                    (&this->left_->fadexpr_,i);
  pFVar5 = this->right_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  dVar1 = (pFVar6->fadexpr_).left_.constant_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  dVar2 = (pFVar7->fadexpr_).left_.constant_;
  dVar10 = cos((((pFVar7->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar8 = (pFVar5->fadexpr_).right_;
  dVar3 = (pFVar8->fadexpr_).left_.constant_;
  dVar11 = sin((((pFVar8->fadexpr_).right_)->fadexpr_).expr_.val_);
  vVar12 = FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
           ::dx(&this->right_->fadexpr_,i);
  iVar4 = (this->left_->fadexpr_).left_.constant_;
  dVar13 = tanh((((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_);
  return ((dVar1 - dVar10 * dVar2) - dVar11 * dVar3) * vVar9 + ((double)iVar4 / dVar13) * vVar12;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}